

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

bool __thiscall SQTable::Get(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  SQHash SVar2;
  _HashNode *p_Var3;
  SQObject local_28;
  
  if ((key->super_SQObject)._type == OT_NULL) {
    return false;
  }
  SVar2 = HashObj(&key->super_SQObject);
  p_Var3 = _Get(this,key,this->_numofnodes - 1U & SVar2);
  if (p_Var3 == (_HashNode *)0x0) {
    bVar1 = false;
  }
  else {
    if ((p_Var3->val).super_SQObject._type == OT_WEAKREF) {
      p_Var3 = (_HashNode *)
               &(((p_Var3->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable._next;
    }
    local_28._type = (p_Var3->val).super_SQObject._type;
    local_28._4_4_ = *(undefined4 *)&(p_Var3->val).super_SQObject.field_0x4;
    local_28._unVal = (p_Var3->val).super_SQObject._unVal;
    SQObjectPtr::operator=(val,&local_28);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SQTable::Get(const SQObjectPtr &key,SQObjectPtr &val)
{
    if(sq_type(key) == OT_NULL)
        return false;
    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        val = _realval(n->val);
        return true;
    }
    return false;
}